

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_edge_neighbors(REF_GRID ref_grid,REF_INT node,REF_INT *node0,REF_INT *node1)

{
  REF_CELL pRVar1;
  REF_INT local_54;
  REF_INT local_50;
  int local_4c;
  REF_INT local_48;
  int local_44;
  REF_INT other;
  REF_INT cell_edge;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_INT *node1_local;
  REF_INT *node0_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->cell[0];
  *node0 = -1;
  *node1 = -1;
  if ((node < 0) || (pRVar1->ref_adj->nnode <= node)) {
    local_4c = -1;
  }
  else {
    local_4c = pRVar1->ref_adj->first[node];
  }
  cell_edge = local_4c;
  if (local_4c == -1) {
    local_50 = -1;
  }
  else {
    local_50 = pRVar1->ref_adj->item[local_4c].ref;
  }
  other = local_50;
  do {
    if (cell_edge == -1) {
      return 0;
    }
    for (local_44 = 0; local_44 < pRVar1->edge_per; local_44 = local_44 + 1) {
      if (node == pRVar1->c2n[pRVar1->e2n[local_44 << 1] + pRVar1->size_per * other]) {
        local_48 = pRVar1->c2n[pRVar1->e2n[local_44 * 2 + 1] + pRVar1->size_per * other];
LAB_002cc138:
        if (*node0 == -1) {
          *node0 = local_48;
        }
        else {
          if (*node1 != -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x2c7,"ref_smooth_edge_neighbors","found more than two boundary edges");
            return 1;
          }
          *node1 = local_48;
        }
      }
      else if (node == pRVar1->c2n[pRVar1->e2n[local_44 * 2 + 1] + pRVar1->size_per * other]) {
        local_48 = pRVar1->c2n[pRVar1->e2n[local_44 << 1] + pRVar1->size_per * other];
        goto LAB_002cc138;
      }
    }
    cell_edge = pRVar1->ref_adj->item[cell_edge].next;
    if (cell_edge == -1) {
      local_54 = -1;
    }
    else {
      local_54 = pRVar1->ref_adj->item[cell_edge].ref;
    }
    other = local_54;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_smooth_edge_neighbors(REF_GRID ref_grid, REF_INT node,
                                             REF_INT *node0, REF_INT *node1) {
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT item, cell, cell_edge, other;

  *node0 = REF_EMPTY;
  *node1 = REF_EMPTY;

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      if (node == ref_cell_e2n(ref_cell, 0, cell_edge, cell)) {
        other = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      } else if (node == ref_cell_e2n(ref_cell, 1, cell_edge, cell)) {
        other = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      } else {
        continue;
      }
      if (REF_EMPTY == *node0) {
        *node0 = other;
        continue;
      }
      if (REF_EMPTY == *node1) {
        *node1 = other;
        continue;
      }
      THROW("found more than two boundary edges");
    }
  }

  return REF_SUCCESS;
}